

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

string_view __thiscall
wabt::ObjdumpLocalNames::Get(ObjdumpLocalNames *this,Index function_index,Index param_2)

{
  const_iterator cVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  string_view sVar4;
  key_type local_10;
  
  local_10.first = function_index;
  local_10.second = param_2;
  cVar1 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this,&local_10);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->names)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = (_Base_ptr)0x0;
    p_Var2 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = cVar1._M_node[1]._M_parent;
    p_Var2 = cVar1._M_node[1]._M_left;
  }
  sVar4._M_str = (char *)p_Var3;
  sVar4._M_len = (size_t)p_Var2;
  return sVar4;
}

Assistant:

std::string_view ObjdumpLocalNames::Get(Index function_index,
                                        Index local_index) const {
  auto iter = names.find(std::pair<Index, Index>(function_index, local_index));
  if (iter == names.end())
    return std::string_view();
  return iter->second;
}